

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O0

void __thiscall hmi::window::set_title(window *this,string_view title)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  string title_string;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator(&local_39);
  uVar1 = *in_RDI;
  uVar2 = std::__cxx11::string::data();
  SDL_SetWindowTitle(uVar1,uVar2);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void window::set_title(std::string_view title) {
    std::string title_string(title);
    SDL_SetWindowTitle(m_window, title_string.data());
  }